

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio-lite.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* getFilesList(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *__return_storage_ptr__,string *cpioArchivePath)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  char *__s;
  runtime_error *this;
  ulong __n;
  DescriptorWrapper fd;
  string filename;
  header_old_cpio header;
  DescriptorWrapper local_80;
  allocator<char> local_79;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_78;
  value_type local_70;
  header_old_cpio local_4a;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78 = __return_storage_ptr__;
  DescriptorWrapper::openFile(&local_80,cpioArchivePath,0);
  do {
    sVar3 = DescriptorWrapper::readTo(&local_80,&local_4a,0x1a);
    if (sVar3 == 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x18);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Unexpected EOF","");
      std::runtime_error::runtime_error(this,(string *)&local_70);
      *(undefined ***)this = &PTR__runtime_error_00108d50;
      *(undefined4 *)(this + 0x10) = 0;
      __cxa_throw(this,&CpioException::typeinfo,std::runtime_error::~runtime_error);
    }
    bVar1 = isHeaderLittleEndian(&local_4a);
    if (bVar1) {
      switchEndianness(&local_4a);
    }
    sVar4 = getFilenameSizeFromBigEndianHeader(&local_4a);
    __n = ((uint)sVar4 & 1) + sVar4;
    __s = (char *)operator_new__(__n);
    memset(__s,0,__n);
    DescriptorWrapper::readTo(&local_80,__s,__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,__s,&local_79);
    iVar2 = std::__cxx11::string::compare((char *)&local_70);
    if (iVar2 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_78,&local_70);
      sVar4 = getFileSizeFromBigEndianHeader(&local_4a);
      DescriptorWrapper::seek(&local_80,((uint)sVar4 & 1) + sVar4,1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    operator_delete__(__s);
  } while (iVar2 != 0);
  DescriptorWrapper::~DescriptorWrapper(&local_80);
  return local_78;
}

Assistant:

vector<string> getFilesList(const string& cpioArchivePath) 
{
	ssize_t sz = -1;
	header_old_cpio header;
	std::vector<std::string> filenames;

	DescriptorWrapper fd = DescriptorWrapper::openFile(cpioArchivePath, O_RDONLY);

	for(;;) {
		sz = fd.readTo(&header, sizeof(header));
		if (sz == 0)
			throw CpioException(CpioException::InvalidInputArchive, "Unexpected EOF");
		if (isHeaderLittleEndian(header))
			switchEndianness(header);
		
		auto filenameSize = getFilenameSizeFromBigEndianHeader(header);
		auto realFilenameSize = filenameSize + filenameSize%2;
		auto cFilename = make_unique<char[]>(realFilenameSize);

		sz = fd.readTo(cFilename.get(), realFilenameSize);
		string filename(cFilename.get());
		if (filename == "TRAILER!!!")
			break;
		else
			filenames.push_back(filename);

		auto bytesToSkip = getFileSizeFromBigEndianHeader(header);
		auto realBytesToSkip = bytesToSkip + bytesToSkip%2;
		fd.seek((off_t)realBytesToSkip, SEEK_CUR);
	}

	return filenames;
}